

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O0

void sqlcheck::PrintMessage
               (Configuration *state,string *sql_statement,bool print_statement,
               RiskLevel pattern_risk_level,PatternType pattern_type,string *title,string *message)

{
  byte bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  RiskLevel *risk_level;
  RiskLevel *risk_level_00;
  PatternType *pattern_type_00;
  key_type local_130;
  RiskLevel local_12c;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_78;
  ColorModifier local_58;
  ColorModifier regular_1;
  ColorModifier regular;
  ColorModifier blue;
  ColorModifier green;
  ColorModifier red;
  string *title_local;
  RiskLevel local_20;
  PatternType pattern_type_local;
  RiskLevel pattern_risk_level_local;
  bool print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  title_local._4_4_ = pattern_type;
  local_20 = pattern_risk_level;
  pattern_type_local._3_1_ = print_statement;
  _pattern_risk_level_local = sql_statement;
  sql_statement_local = (string *)state;
  ColorModifier::ColorModifier(&green,FG_RED,(bool)(state->color_mode & 1),true);
  ColorModifier::ColorModifier
            (&blue,FG_GREEN,(bool)((byte)sql_statement_local->_M_dataplus & 1),true);
  ColorModifier::ColorModifier
            (&regular,FG_BLUE,(bool)((byte)sql_statement_local->_M_dataplus & 1),true);
  ColorModifier::ColorModifier
            (&regular_1,FG_DEFAULT,(bool)((byte)sql_statement_local->_M_dataplus & 1),false);
  if ((pattern_type_local._3_1_ & 1) == 1) {
    std::operator<<((ostream *)&std::cout,"\n-------------------------------------------------\n");
    ColorModifier::ColorModifier
              (&local_58,FG_DEFAULT,(bool)((byte)sql_statement_local->_M_dataplus & 1),false);
    if (((byte)sql_statement_local->_M_dataplus & 1) == 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"SQL Statement at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)&sql_statement_local[4].field_2);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = operator<<(poVar2,&green);
      WrapText(&local_78,sql_statement);
      poVar2 = std::operator<<(poVar2,(string *)&local_78);
      poVar2 = std::operator<<(poVar2,(string *)&sql_statement_local[1]._M_string_length);
      poVar2 = operator<<(poVar2,&local_58);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"SQL Statement at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)&sql_statement_local[4].field_2);
      poVar2 = std::operator<<(poVar2,": ");
      WrapText(&local_a8,sql_statement);
      poVar2 = std::operator<<(poVar2,(string *)&local_a8);
      poVar2 = std::operator<<(poVar2,(string *)&sql_statement_local[1]._M_string_length);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  if (((byte)sql_statement_local->_M_dataplus & 1) == 1) {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[");
      poVar2 = std::operator<<(poVar2,(string *)&sql_statement_local->_M_string_length);
      std::operator<<(poVar2,"]: ");
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"(");
    poVar2 = operator<<(poVar2,&blue);
    RiskLevelToString_abi_cxx11_(&local_c8,(sqlcheck *)&local_20,risk_level);
    poVar2 = std::operator<<(poVar2,(string *)&local_c8);
    poVar2 = operator<<(poVar2,&regular_1);
    std::operator<<(poVar2,") ");
    std::__cxx11::string::~string((string *)&local_c8);
    poVar2 = operator<<((ostream *)&std::cout,&regular);
    poVar2 = std::operator<<(poVar2,(string *)title);
    poVar2 = operator<<(poVar2,&regular_1);
    std::operator<<(poVar2,"\n");
  }
  else {
    bVar1 = std::__cxx11::string::empty();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[");
      poVar2 = std::operator<<(poVar2,(string *)&sql_statement_local->_M_string_length);
      std::operator<<(poVar2,"]: ");
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"(");
    RiskLevelToString_abi_cxx11_(&local_e8,(sqlcheck *)&local_20,risk_level_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_e8);
    std::operator<<(poVar2,") ");
    std::__cxx11::string::~string((string *)&local_e8);
    poVar2 = std::operator<<((ostream *)&std::cout,"(");
    PatternTypeToString_abi_cxx11_(&local_108,(sqlcheck *)((long)&title_local + 4),pattern_type_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_108);
    std::operator<<(poVar2,") ");
    std::__cxx11::string::~string((string *)&local_108);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)title);
    std::operator<<(poVar2,"\n");
  }
  if ((sql_statement_local[2]._M_string_length & 0x100000000) == 0x100000000) {
    WrapText(&local_128,message);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_128);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_128);
  }
  local_12c = local_20;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      (sql_statement_local + 3),(key_type *)&local_12c);
  *pmVar3 = *pmVar3 + 1;
  local_130 = 0;
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      (sql_statement_local + 3),&local_130);
  *pmVar3 = *pmVar3 + 1;
  return;
}

Assistant:

void PrintMessage(Configuration& state,
                  const std::string sql_statement,
                  const bool print_statement,
                  const RiskLevel pattern_risk_level,
                  const PatternType pattern_type,
                  const std::string title,
                  const std::string message){

  ColorModifier red(ColorCode::FG_RED, state.color_mode, true);
  ColorModifier green(ColorCode::FG_GREEN, state.color_mode, true);
  ColorModifier blue(ColorCode::FG_BLUE, state.color_mode, true);
  ColorModifier regular(ColorCode::FG_DEFAULT, state.color_mode, false);

  if(print_statement == true){
    std::cout << "\n-------------------------------------------------\n";
    ColorModifier regular(ColorCode::FG_DEFAULT, state.color_mode, false);

    if(state.color_mode == true){
      std::cout << "SQL Statement at line " << state.line_number <<": " << red << WrapText(sql_statement) << state.delimiter << regular << "\n";
    }
    else {
      std::cout << "SQL Statement at line " << state.line_number << ": " << WrapText(sql_statement) << state.delimiter << "\n";
    }
  }

  if(state.color_mode == true){
    if(state.file_name.empty() == false){
      std::cout << "[" << state.file_name << "]: ";
    }

    std::cout << "(" << green << RiskLevelToString(pattern_risk_level) << regular << ") ";
    std::cout << blue << title << regular << "\n";
  }
  else {
    if(state.file_name.empty() == false){
      std::cout << "[" << state.file_name << "]: ";
    }

    std::cout << "(" << RiskLevelToString(pattern_risk_level) << ") ";
    std::cout << "(" << PatternTypeToString(pattern_type) << ") ";
    std::cout << title << "\n";
  }

  // Print detailed message only in verbose mode
  if(state.verbose == true){
    std::cout << WrapText(message) << "\n";
  }

  // Update checker stats
  state.checker_stats[pattern_risk_level]++;
  state.checker_stats[RISK_LEVEL_ALL]++;

}